

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_base.c
# Opt level: O0

MPP_RET set_filter(void *hal)

{
  long lVar1;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  uint local_40;
  RK_U32 i;
  RK_S32 tmp;
  Pps *p_pps;
  RK_U32 qp;
  Vp8eSps *sps;
  HalVp8eCtx *ctx;
  void *hal_local;
  
  if (*(int *)((long)hal + 0xc4) != 0) {
    lVar1 = *(long *)((long)hal + 0x128);
    if (*(int *)((long)hal + 0x6924) == 0) {
      *(undefined4 *)((long)hal + 0xa8) = 0x1a;
      if ((*(int *)(lVar1 + 0x1c) << 6) / 0x80 + 8 < 0) {
        local_4c = 0;
      }
      else {
        if ((*(int *)(lVar1 + 0x1c) << 6) / 0x80 + 8 < 0x40) {
          local_50 = (*(int *)(lVar1 + 0x1c) << 6) / 0x80 + 8;
        }
        else {
          local_50 = 0x3f;
        }
        local_4c = local_50;
      }
      *(int *)(lVar1 + 0x2c) = local_4c;
      if ((*(int *)(lVar1 + 0x20) << 6) / 0x80 + 8 < 0) {
        local_54 = 0;
      }
      else {
        if ((*(int *)(lVar1 + 0x20) << 6) / 0x80 + 8 < 0x40) {
          local_58 = (*(int *)(lVar1 + 0x20) << 6) / 0x80 + 8;
        }
        else {
          local_58 = 0x3f;
        }
        local_54 = local_58;
      }
      *(int *)(lVar1 + 0x30) = local_54;
      if ((*(int *)(lVar1 + 0x24) << 6) / 0x80 + 8 < 0) {
        local_5c = 0;
      }
      else {
        if ((*(int *)(lVar1 + 0x24) << 6) / 0x80 + 8 < 0x40) {
          local_60 = (*(int *)(lVar1 + 0x24) << 6) / 0x80 + 8;
        }
        else {
          local_60 = 0x3f;
        }
        local_5c = local_60;
      }
      *(int *)(lVar1 + 0x34) = local_5c;
      if ((*(int *)(lVar1 + 0x28) << 6) / 0x80 + 8 < 0) {
        local_64 = 0;
      }
      else {
        if ((*(int *)(lVar1 + 0x28) << 6) / 0x80 + 8 < 0x40) {
          local_68 = (*(int *)(lVar1 + 0x28) << 6) / 0x80 + 8;
        }
        else {
          local_68 = 0x3f;
        }
        local_64 = local_68;
      }
      *(int *)(lVar1 + 0x38) = local_64;
    }
    else {
      *(RK_S32 *)((long)hal + 0xa8) = 0xc;
      *(RK_S32 *)(lVar1 + 0x2c) = inter_level_tbl[*(int *)(lVar1 + 0x1c)];
      *(RK_S32 *)(lVar1 + 0x30) = inter_level_tbl[*(int *)(lVar1 + 0x20)];
      *(RK_S32 *)(lVar1 + 0x34) = inter_level_tbl[*(int *)(lVar1 + 0x24)];
      *(RK_S32 *)(lVar1 + 0x38) = inter_level_tbl[*(int *)(lVar1 + 0x28)];
    }
  }
  if (*(int *)((long)hal + 200) != 0) {
    *(undefined4 *)((long)hal + 0xac) = 0;
  }
  if (*(char *)((long)hal + 0xcc) == '\0') {
    hal_local._4_4_ = MPP_NOK;
  }
  else if (*(char *)((long)hal + 0xcc) == '\x02') {
    *(undefined1 *)((long)hal + 0xcc) = 1;
    hal_local._4_4_ = MPP_NOK;
  }
  else if (*(int *)((long)hal + 0xa8) == 0) {
    *(undefined4 *)((long)hal + 0xf0) = 0;
    *(undefined4 *)((long)hal + 0xf4) = 0;
    *(undefined4 *)((long)hal + 0xf8) = 0;
    *(undefined4 *)((long)hal + 0xfc) = 0;
    *(undefined4 *)((long)hal + 0xd0) = 0;
    *(undefined4 *)((long)hal + 0xd4) = 0;
    *(undefined4 *)((long)hal + 0xd8) = 0;
    *(undefined4 *)((long)hal + 0xdc) = 0;
    hal_local._4_4_ = MPP_NOK;
  }
  else if (((*(char *)(*(long *)((long)hal + 0x37e8) + 0x27) == '\0') &&
           (*(char *)(*(long *)((long)hal + 0x37e8) + 0x29) == '\0')) &&
          (*(char *)(*(long *)((long)hal + 0x37e8) + 0x28) == '\0')) {
    *(undefined8 *)((long)hal + 0xf0) = *(undefined8 *)((long)hal + 0x100);
    *(undefined8 *)((long)hal + 0xf8) = *(undefined8 *)((long)hal + 0x108);
    *(undefined8 *)((long)hal + 0xd0) = *(undefined8 *)((long)hal + 0xe0);
    *(undefined8 *)((long)hal + 0xd8) = *(undefined8 *)((long)hal + 0xe8);
    hal_local._4_4_ = MPP_NOK;
  }
  else {
    *(undefined4 *)((long)hal + 0xf0) = 2;
    *(undefined4 *)((long)hal + 0xf4) = 0;
    *(undefined4 *)((long)hal + 0xf8) = 0xfffffffe;
    *(undefined4 *)((long)hal + 0xfc) = 0xfffffffe;
    *(undefined4 *)((long)hal + 0xd0) = 4;
    *(undefined4 *)((long)hal + 0xd4) = 0xfffffffe;
    *(undefined4 *)((long)hal + 0xd8) = 2;
    *(undefined4 *)((long)hal + 0xdc) = 4;
    for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
      if (*(int *)((long)hal + (ulong)local_40 * 4 + 0xf0) < -0x3f) {
        local_6c = 0xffffffc1;
      }
      else {
        if (*(int *)((long)hal + (ulong)local_40 * 4 + 0xf0) < 0x40) {
          local_70 = *(undefined4 *)((long)hal + (ulong)local_40 * 4 + 0xf0);
        }
        else {
          local_70 = 0x3f;
        }
        local_6c = local_70;
      }
      *(undefined4 *)((long)hal + (ulong)local_40 * 4 + 0xf0) = local_6c;
      if (*(int *)((long)hal + (ulong)local_40 * 4 + 0xd0) < -0x3f) {
        local_74 = 0xffffffc1;
      }
      else {
        if (*(int *)((long)hal + (ulong)local_40 * 4 + 0xd0) < 0x40) {
          local_78 = *(undefined4 *)((long)hal + (ulong)local_40 * 4 + 0xd0);
        }
        else {
          local_78 = 0x3f;
        }
        local_74 = local_78;
      }
      *(undefined4 *)((long)hal + (ulong)local_40 * 4 + 0xd0) = local_74;
    }
    hal_local._4_4_ = MPP_OK;
  }
  return hal_local._4_4_;
}

Assistant:

static MPP_RET set_filter(void *hal)
{
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;
    Vp8eSps *sps = &ctx->sps;

    if (sps->auto_filter_level) {
        RK_U32 qp = 36;
        Pps *p_pps = ctx->ppss.pps;
        if (ctx->frame_type == VP8E_FRM_KEY) {
            RK_S32 tmp = (qp * 64) / 128 + 8;
            sps->filter_level = MPP_CLIP3(0, 63, tmp);
            p_pps->level_sgm[0] = MPP_CLIP3(0, 63, (p_pps->qp_sgm[0] * 64) / 128 + 8);
            p_pps->level_sgm[1] = MPP_CLIP3(0, 63, (p_pps->qp_sgm[1] * 64) / 128 + 8);
            p_pps->level_sgm[2] = MPP_CLIP3(0, 63, (p_pps->qp_sgm[2] * 64) / 128 + 8);
            p_pps->level_sgm[3] = MPP_CLIP3(0, 63, (p_pps->qp_sgm[3] * 64) / 128 + 8);
        } else {
            sps->filter_level = inter_level_tbl[qp];
            p_pps->level_sgm[0] = inter_level_tbl[p_pps->qp_sgm[0]];
            p_pps->level_sgm[1] = inter_level_tbl[p_pps->qp_sgm[1]];
            p_pps->level_sgm[2] = inter_level_tbl[p_pps->qp_sgm[2]];
            p_pps->level_sgm[3] = inter_level_tbl[p_pps->qp_sgm[3]];
        }
    }

    if (sps->auto_filter_sharpness) {
        sps->filter_sharpness = 0;
    }

    if (!sps->filter_delta_enable)
        return MPP_NOK;

    if (sps->filter_delta_enable == 2) {
        sps->filter_delta_enable = 1;
        return MPP_NOK;
    }

    if (sps->filter_level == 0) {
        sps->ref_delta[0] =  0;      /* Intra frame */
        sps->ref_delta[1] =  0;      /* Last frame */
        sps->ref_delta[2] =  0;      /* Golden frame */
        sps->ref_delta[3] =  0;      /* Altref frame */
        sps->mode_delta[0] = 0;      /* BPRED */
        sps->mode_delta[1] = 0;      /* Zero */
        sps->mode_delta[2] = 0;      /* New mv */
        sps->mode_delta[3] = 0;      /* Split mv */
        return MPP_NOK;
    }

    if (!ctx->picbuf.cur_pic->ipf && !ctx->picbuf.cur_pic->grf &&
        !ctx->picbuf.cur_pic->arf) {
        memcpy(sps->ref_delta, sps->old_ref_delta, sizeof(sps->ref_delta));
        memcpy(sps->mode_delta, sps->old_mode_delta, sizeof(sps->mode_delta));
        return MPP_NOK;
    }

    sps->ref_delta[0] =  2;      /* Intra frame */
    sps->ref_delta[1] =  0;      /* Last frame */
    sps->ref_delta[2] = -2;      /* Golden frame */
    sps->ref_delta[3] = -2;      /* Altref frame */

    sps->mode_delta[0] =  4;     /* BPRED */
    sps->mode_delta[1] = -2;     /* Zero */
    sps->mode_delta[2] =  2;     /* New mv */
    sps->mode_delta[3] =  4;     /* Split mv */

    {
        RK_U32 i = 0;
        for (i = 0; i < 4; i++) {
            sps->ref_delta[i] = MPP_CLIP3(-0x3f, 0x3f, sps->ref_delta[i]);
            sps->mode_delta[i] = MPP_CLIP3(-0x3f, 0x3f, sps->mode_delta[i]);
        }
    }
    return MPP_OK;
}